

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O1

string * __thiscall
spirv_cross::CompilerHLSL::image_type_hlsl_modern_abi_cxx11_
          (string *__return_storage_ptr__,CompilerHLSL *this,SPIRType *type,uint32_t id)

{
  uint32_t uVar1;
  bool bVar2;
  SPIRType *pSVar3;
  size_type sVar4;
  CompilerError *this_00;
  uint *puVar5;
  char (*in_R8) [2];
  char (*in_R9) [2];
  byte bVar6;
  bool bVar7;
  char (*ts_7) [2];
  uint32_t components;
  uint32_t id_local;
  char *dim;
  char *arrayed;
  string local_80;
  char *rw;
  char *ms;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  id_local = id;
  pSVar3 = Variant::get<spirv_cross::SPIRType>
                     ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                      super_VectorView<spirv_cross::Variant>.ptr + (type->image).type.id);
  dim = (char *)0x0;
  components = 4;
  if ((this->hlsl_options).nonwritable_uav_texture_as_srv == true) {
    bVar2 = Compiler::has_decoration((Compiler *)this,(ID)id_local,DecorationNonWritable);
  }
  else {
    bVar2 = false;
  }
  switch((type->image).dim) {
  case Dim1D:
    bVar7 = (type->image).sampled == 2;
    dim = "1D";
    break;
  case Dim2D:
    bVar7 = (type->image).sampled == 2;
    dim = "2D";
    break;
  case Dim3D:
    bVar7 = (type->image).sampled == 2;
    dim = "3D";
    break;
  case Cube:
    if ((type->image).sampled == 2) {
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"RWTextureCube does not exist in HLSL.");
      goto LAB_001d0ba1;
    }
    dim = "Cube";
    goto LAB_001d08c4;
  case DimRect:
    this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
    CompilerError::CompilerError
              (this_00,"Rectangle texture support is not yet implemented for HLSL.");
    goto LAB_001d0ba1;
  case Buffer:
    uVar1 = (type->image).sampled;
    if (uVar1 == 2) {
      sVar4 = ::std::
              _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::count(&(this->super_CompilerGLSL).super_Compiler.interlocked_resources._M_h,
                      &id_local);
      if (sVar4 == 0) {
        bVar7 = (type->image).sampled == 2;
        arrayed = "RW";
        if (bVar2 != false) {
          arrayed = "";
        }
        if (bVar7 && bVar2 == false) {
          image_format_to_type_abi_cxx11_(&local_80,(type->image).format,pSVar3->basetype);
        }
        else {
          puVar5 = (uint *)0x0;
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                    ((spirv_cross *)local_50,this,pSVar3);
          join<std::__cxx11::string,unsigned_int&>
                    (&local_80,(spirv_cross *)local_50,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &components,puVar5);
        }
        join<char_const*&,char_const(&)[8],std::__cxx11::string,char_const(&)[2]>
                  (__return_storage_ptr__,(spirv_cross *)&arrayed,(char **)0x38ef52,
                   (char (*) [8])&local_80,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3a3c7f,
                   in_R9);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != &local_80.field_2) {
          operator_delete(local_80._M_dataplus._M_p);
        }
        if (bVar7 && bVar2 == false) {
          return __return_storage_ptr__;
        }
        if (local_50[0] == local_40) {
          return __return_storage_ptr__;
        }
      }
      else {
        image_format_to_type_abi_cxx11_(&local_80,(type->image).format,pSVar3->basetype);
        join<char_const(&)[25],std::__cxx11::string,char_const(&)[2]>
                  (__return_storage_ptr__,(spirv_cross *)"RasterizerOrderedBuffer<",
                   (char (*) [25])&local_80,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3a3c7f,
                   in_R8);
        local_50[0] = local_80._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p == &local_80.field_2) {
          return __return_storage_ptr__;
        }
      }
    }
    else {
      if (uVar1 != 1) {
        this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError
                  (this_00,
                   "Sampler buffers must be either sampled or unsampled. Cannot deduce in runtime.")
        ;
        goto LAB_001d0ba1;
      }
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(&local_80,this,pSVar3,0);
      join<char_const(&)[8],std::__cxx11::string,unsigned_int&,char_const(&)[2]>
                (__return_storage_ptr__,(spirv_cross *)0x38ef52,(char (*) [8])&local_80,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&components,
                 (uint *)0x3a3c7f,in_R9);
      local_50[0] = local_80._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p == &local_80.field_2) {
        return __return_storage_ptr__;
      }
    }
    goto LAB_001d09fc;
  case DimSubpassData:
    dim = "2D";
LAB_001d08c4:
    bVar7 = false;
    break;
  default:
    this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
    CompilerError::CompilerError(this_00,"Invalid dimension.");
LAB_001d0ba1:
    __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
  }
  arrayed = "Array";
  if ((type->image).arrayed == false) {
    arrayed = "";
  }
  ms = "MS";
  if ((type->image).ms == false) {
    ms = "";
  }
  rw = "RW";
  if (bVar2 != false) {
    rw = "";
  }
  if (bVar7 == false) {
    rw = "";
  }
  bVar6 = (bVar2 ^ 1U) & bVar7;
  if (bVar6 == 1) {
    sVar4 = ::std::
            _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::count(&(this->super_CompilerGLSL).super_Compiler.interlocked_resources._M_h,&id_local)
    ;
    if (sVar4 != 0) {
      rw = "RasterizerOrdered";
    }
    ts_7 = (char (*) [2])0x1d0968;
    image_format_to_type_abi_cxx11_(&local_80,(type->image).format,pSVar3->basetype);
  }
  else {
    puVar5 = (uint *)0x0;
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
              ((spirv_cross *)local_50,this,pSVar3);
    ts_7 = (char (*) [2])0x1d0993;
    join<std::__cxx11::string,unsigned_int&>
              (&local_80,(spirv_cross *)local_50,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&components,
               puVar5);
  }
  join<char_const*&,char_const(&)[8],char_const*&,char_const*&,char_const*&,char_const(&)[2],std::__cxx11::string,char_const(&)[2]>
            (__return_storage_ptr__,(spirv_cross *)&rw,(char **)"Texture",(char (*) [8])&dim,&ms,
             &arrayed,(char **)0x361f9d,(char (*) [2])&local_80,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3a3c7f,ts_7);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p);
  }
  if ((bVar6 == 0) && (local_50[0] != local_40)) {
LAB_001d09fc:
    operator_delete(local_50[0]);
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerHLSL::image_type_hlsl_modern(const SPIRType &type, uint32_t id)
{
	auto &imagetype = get<SPIRType>(type.image.type);
	const char *dim = nullptr;
	bool typed_load = false;
	uint32_t components = 4;

	bool force_image_srv = hlsl_options.nonwritable_uav_texture_as_srv && has_decoration(id, DecorationNonWritable);

	switch (type.image.dim)
	{
	case Dim1D:
		typed_load = type.image.sampled == 2;
		dim = "1D";
		break;
	case Dim2D:
		typed_load = type.image.sampled == 2;
		dim = "2D";
		break;
	case Dim3D:
		typed_load = type.image.sampled == 2;
		dim = "3D";
		break;
	case DimCube:
		if (type.image.sampled == 2)
			SPIRV_CROSS_THROW("RWTextureCube does not exist in HLSL.");
		dim = "Cube";
		break;
	case DimRect:
		SPIRV_CROSS_THROW("Rectangle texture support is not yet implemented for HLSL."); // TODO
	case DimBuffer:
		if (type.image.sampled == 1)
			return join("Buffer<", type_to_glsl(imagetype), components, ">");
		else if (type.image.sampled == 2)
		{
			if (interlocked_resources.count(id))
				return join("RasterizerOrderedBuffer<", image_format_to_type(type.image.format, imagetype.basetype),
				            ">");

			typed_load = !force_image_srv && type.image.sampled == 2;

			const char *rw = force_image_srv ? "" : "RW";
			return join(rw, "Buffer<",
			            typed_load ? image_format_to_type(type.image.format, imagetype.basetype) :
			                         join(type_to_glsl(imagetype), components),
			            ">");
		}
		else
			SPIRV_CROSS_THROW("Sampler buffers must be either sampled or unsampled. Cannot deduce in runtime.");
	case DimSubpassData:
		dim = "2D";
		typed_load = false;
		break;
	default:
		SPIRV_CROSS_THROW("Invalid dimension.");
	}
	const char *arrayed = type.image.arrayed ? "Array" : "";
	const char *ms = type.image.ms ? "MS" : "";
	const char *rw = typed_load && !force_image_srv ? "RW" : "";

	if (force_image_srv)
		typed_load = false;

	if (typed_load && interlocked_resources.count(id))
		rw = "RasterizerOrdered";

	return join(rw, "Texture", dim, ms, arrayed, "<",
	            typed_load ? image_format_to_type(type.image.format, imagetype.basetype) :
	                         join(type_to_glsl(imagetype), components),
	            ">");
}